

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void add_qemu_ldst_label(TCGContext_conflict9 *s,_Bool is_ld,_Bool is_64,TCGMemOpIdx oi,
                        TCGReg datalo,TCGReg datahi,TCGReg addrlo,TCGReg addrhi,tcg_insn_unit *raddr
                        ,tcg_insn_unit **label_ptr)

{
  TCGLabelQemuLdst_conflict *pTVar1;
  TCGLabelQemuLdst_conflict *label;
  TCGReg datahi_local;
  TCGReg datalo_local;
  TCGMemOpIdx oi_local;
  _Bool is_64_local;
  _Bool is_ld_local;
  TCGContext_conflict9 *s_local;
  
  pTVar1 = new_ldst_label(s);
  pTVar1->is_ld = is_ld;
  pTVar1->oi = oi;
  pTVar1->type = (uint)is_64;
  pTVar1->datalo_reg = datalo;
  pTVar1->datahi_reg = datahi;
  pTVar1->addrlo_reg = addrlo;
  pTVar1->addrhi_reg = addrhi;
  pTVar1->raddr = raddr;
  pTVar1->label_ptr[0] = *label_ptr;
  return;
}

Assistant:

static void add_qemu_ldst_label(TCGContext *s, bool is_ld, bool is_64,
                                TCGMemOpIdx oi,
                                TCGReg datalo, TCGReg datahi,
                                TCGReg addrlo, TCGReg addrhi,
                                tcg_insn_unit *raddr,
                                tcg_insn_unit **label_ptr)
{
    TCGLabelQemuLdst *label = new_ldst_label(s);

    label->is_ld = is_ld;
    label->oi = oi;
    label->type = is_64 ? TCG_TYPE_I64 : TCG_TYPE_I32;
    label->datalo_reg = datalo;
    label->datahi_reg = datahi;
    label->addrlo_reg = addrlo;
    label->addrhi_reg = addrhi;
    label->raddr = raddr;
    label->label_ptr[0] = label_ptr[0];
    if (TARGET_LONG_BITS > TCG_TARGET_REG_BITS) {
        label->label_ptr[1] = label_ptr[1];
    }
}